

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fctkern__log_suite_skip(fctkern_t *nk,char *condition,char *name)

{
  size_t sVar1;
  fct_logger_i *logger_00;
  fct_logger_i *logger;
  size_t num_itemslogger;
  size_t item_ilogger;
  char *name_local;
  char *condition_local;
  fctkern_t *nk_local;
  
  if ((nk != (fctkern_t *)0x0) && (nk != (fctkern_t *)0xfffffffffffffe68)) {
    sVar1 = fct_nlist__size(&nk->logger_list);
    for (num_itemslogger = 0; num_itemslogger != sVar1; num_itemslogger = num_itemslogger + 1) {
      logger_00 = (fct_logger_i *)fct_nlist__at(&nk->logger_list,num_itemslogger);
      fct_logger__on_test_suite_skip(logger_00,condition,name);
    }
  }
  return;
}

Assistant:

static void
fctkern__log_suite_skip(fctkern_t *nk, char const *condition, char const *name)
{
    if ( nk == NULL )
    {
        return;
    }
    FCT_NLIST_FOREACH_BGN(fct_logger_i*, logger, &(nk->logger_list))
    {
        fct_logger__on_test_suite_skip(logger, condition, name);
    }
    FCT_NLIST_FOREACH_END();
}